

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<kj::ArrayPtr<const_capnp::word>_> * __thiscall
kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator=
          (Array<kj::ArrayPtr<const_capnp::word>_> *this,
          Array<kj::ArrayPtr<const_capnp::word>_> *other)

{
  dispose(this);
  this->ptr = other->ptr;
  this->size_ = other->size_;
  this->disposer = other->disposer;
  other->ptr = (ArrayPtr<const_capnp::word> *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline Array& operator=(Array&& other) {
    dispose();
    ptr = other.ptr;
    size_ = other.size_;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.size_ = 0;
    return *this;
  }